

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

Maybe<capnp::compiler::BrandedDecl> * __thiscall
capnp::compiler::BrandScope::lookupParameter
          (Maybe<capnp::compiler::BrandedDecl> *__return_storage_ptr__,BrandScope *this,
          Resolver *resolver,uint64_t scopeId,uint index)

{
  BrandedDecl *pBVar1;
  Reader brand;
  undefined1 auVar2 [32];
  NullableValue<capnp::compiler::BrandedDecl> *pNVar3;
  undefined1 uStack_171;
  undefined4 uStack_16c;
  undefined1 local_138 [48];
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Fault local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  char local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40 [16];
  
  while( true ) {
    if (this->leafId == scopeId) {
      if ((ulong)index < (this->params).size_) {
        pBVar1 = (this->params).ptr;
        (__return_storage_ptr__->ptr).isSet = true;
        BrandedDecl::BrandedDecl(&(__return_storage_ptr__->ptr).field_1.value,pBVar1 + index);
      }
      else if (this->inherited == true) {
        (__return_storage_ptr__->ptr).isSet = false;
      }
      else {
        (*resolver->_vptr_Resolver[2])(&local_a0,resolver,0x1e);
        if (local_78 == '\x01') {
          local_b8 = local_50;
          uStack_b0 = uStack_48;
          local_c8 = local_60;
          uStack_c0 = uStack_58;
          local_d8 = local_70;
          uStack_d0 = uStack_68;
          local_108 = local_70;
          uStack_100 = uStack_68;
          local_f8 = local_60;
          uStack_f0 = uStack_58;
          local_e8 = local_50;
          uStack_e0 = uStack_48;
        }
        brand.reader._39_1_ = uStack_171;
        brand.reader.structDataSize = 0;
        brand.reader.structPointerCount = 0;
        brand.reader.elementSize = INLINE_COMPOSITE;
        brand.reader._44_4_ = uStack_16c;
        brand.reader.nestingLimit = 0x7fffffff;
        auVar2 = ZEXT1632(ZEXT816(0));
        brand.reader.segment = (SegmentReader *)auVar2._0_8_;
        brand.reader.capTable = (CapTableReader *)auVar2._8_8_;
        brand.reader.ptr = (byte *)auVar2._16_8_;
        brand.reader.elementCount = auVar2._24_4_;
        brand.reader.step = auVar2._28_4_;
        evaluateBrand((BrandScope *)local_40,(Resolver *)this,(ResolvedDecl *)resolver,brand,
                      (uint)local_138);
        (__return_storage_ptr__->ptr).isSet = true;
        (__return_storage_ptr__->ptr).field_1.value.body.tag = 1;
        *(Exception **)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = local_a0.exception;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uStack_98;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) = local_90;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = uStack_88;
        *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = local_80;
        *(char *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = local_78;
        if (local_78 != '\0') {
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x58) = local_b8;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x60) = uStack_b0;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x48) = local_c8;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x50) = uStack_c0;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x38) = local_d8;
          *(undefined8 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x40) = uStack_d0;
        }
        (__return_storage_ptr__->ptr).field_1.value.brand.disposer = (Disposer *)local_40._0_8_;
        (__return_storage_ptr__->ptr).field_1.value.brand.ptr = (BrandScope *)local_40._8_8_;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.segment = (SegmentReader *)0x0;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.capTable = (CapTableReader *)0x0;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.data = (void *)0x0;
        (__return_storage_ptr__->ptr).field_1.value.source._reader.pointers = (WirePointer *)0x0;
        pNVar3 = &__return_storage_ptr__->ptr;
        *(StructDataBitCount *)((long)&pNVar3->field_1 + 0x98) = 0;
        *(StructPointerCount *)((long)&pNVar3->field_1 + 0x9c) = 0;
        *(undefined2 *)((long)&pNVar3->field_1 + 0x9e) = 0;
        *(undefined8 *)&(__return_storage_ptr__->ptr).field_1.value.source._reader.nestingLimit =
             0x7fffffff;
      }
      return __return_storage_ptr__;
    }
    if ((this->parent).ptr.ptr == (BrandScope *)0x0) break;
    this = (this->parent).ptr.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
            (&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
             ,0x159,FAILED,(char *)0x0,"\"scope is not a parent\"",
             (char (*) [22])"scope is not a parent");
  kj::_::Debug::Fault::fatal(&local_a0);
}

Assistant:

kj::Maybe<BrandedDecl> BrandScope::lookupParameter(
    Resolver& resolver, uint64_t scopeId, uint index) {
  // Returns null if the param should be inherited from the client scope.

  if (scopeId == leafId) {
    if (index < params.size()) {
      return params[index];
    } else if (inherited) {
      return kj::none;
    } else {
      // Unbound and not inherited, so return AnyPointer.
      auto decl = resolver.resolveBuiltin(Declaration::BUILTIN_ANY_POINTER);
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
          Expression::Reader());
    }
  } else KJ_IF_SOME(p, parent) {
    return p.get()->lookupParameter(resolver, scopeId, index);
  } else {
    KJ_FAIL_REQUIRE("scope is not a parent");
  }
}